

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

void hash_table_rehash(HashTable *ht,int new_size_index)

{
  HashEntry *pHVar1;
  HashEntry *local_58;
  HashEntry *entry;
  HashEntry *table;
  HashTable old_ht;
  int new_size_index_local;
  HashTable *ht_local;
  
  if (new_size_index < 0x1f) {
    old_ht.deleted_entries = new_size_index;
    pHVar1 = (HashEntry *)raviX_calloc((ulong)hash_sizes[new_size_index].size,0x18);
    memcpy(&table,ht,0x30);
    ht->table = pHVar1;
    ht->size_index = old_ht.deleted_entries;
    ht->size = hash_sizes[ht->size_index].size;
    ht->rehash = hash_sizes[ht->size_index].rehash;
    ht->max_entries = hash_sizes[ht->size_index].max_entries;
    ht->entries = 0;
    ht->deleted_entries = 0;
    for (local_58 = raviX_hash_table_next_entry((HashTable *)&table,(HashEntry *)0x0);
        local_58 != (HashEntry *)0x0;
        local_58 = raviX_hash_table_next_entry((HashTable *)&table,local_58)) {
      raviX_hash_table_insert_pre_hashed(ht,local_58->hash,local_58->key,local_58->data);
    }
    raviX_free(table);
  }
  return;
}

Assistant:

static void
hash_table_rehash(HashTable *ht, int new_size_index)
{
	HashTable old_ht;
	HashEntry *table, *entry;

	if (new_size_index >= ARRAY_SIZE(hash_sizes))
		return;

	table = (HashEntry *) raviX_calloc(hash_sizes[new_size_index].size, sizeof(*ht->table));

	old_ht = *ht;

	ht->table = table;
	ht->size_index = new_size_index;
	ht->size = hash_sizes[ht->size_index].size;
	ht->rehash = hash_sizes[ht->size_index].rehash;
	ht->max_entries = hash_sizes[ht->size_index].max_entries;
	ht->entries = 0;
	ht->deleted_entries = 0;

	hash_table_foreach(&old_ht, entry) {
		raviX_hash_table_insert_pre_hashed(ht, entry->hash,
					     entry->key, entry->data);
	}

	raviX_free(old_ht.table);
}